

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::EnumDescriptorTest_IsClosed_Test::TestBody
          (EnumDescriptorTest_IsClosed_Test *this)

{
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>_>
  *pVVar2;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *pVVar3;
  FileDescriptor *pFVar4;
  Nonnull<const_char_*> failure_msg;
  char *in_R9;
  pointer *__ptr;
  string_view value;
  AssertionResult gtest_ar__1;
  DescriptorPool pool3;
  FileDescriptorProto foo_file3;
  Message local_1c0;
  AssertHelper local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  AssertHelper local_1a8;
  string local_1a0;
  undefined1 local_180 [8];
  _Head_base<0UL,_absl::lts_20250127::flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>_*,_false>
  local_178;
  undefined1 local_108 [216];
  ArenaStringPtr local_30 [4];
  
  local_180[0] = (internal)EnumDescriptor::is_closed((this->super_EnumDescriptorTest).enum_);
  local_178._M_head_impl =
       (flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
        *)0x0;
  if (!(bool)local_180[0]) {
    testing::Message::Message((Message *)&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_108,(internal *)local_180,(AssertionResult *)"enum_->is_closed()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x720,(char *)local_108._0_8_);
    testing::internal::AssertHelper::operator=(&local_1b8,(Message *)&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1b8);
    if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
      operator_delete((void *)local_108._0_8_,CONCAT71(local_108._17_7_,local_108[0x10]) + 1);
    }
    if ((long *)local_1a0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1a0._M_dataplus._M_p + 8))();
    }
  }
  if (local_178._M_head_impl !=
      (flat_hash_map<std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_const_void_*>_>,_std::equal_to<std::pair<const_void_*,_const_void_*>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_void_*>,_std::unique_ptr<google::protobuf::DescriptorPool::MemoBase,_std::default_delete<google::protobuf::DescriptorPool::MemoBase>_>_>_>_>
       *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_178._M_head_impl);
  }
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_108,(Arena *)0x0);
  FileDescriptor::CopyTo
            ((this->super_EnumDescriptorTest).foo_file_,(FileDescriptorProto *)local_108);
  local_108[0x10] = local_108[0x10] | 4;
  if ((local_108._8_8_ & 1) != 0) {
    local_108._8_8_ = *(undefined8 *)(local_108._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "proto3";
  value._M_len = 6;
  protobuf::internal::ArenaStringPtr::Set(local_30,value,(Arena *)local_108._8_8_);
  pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>>
                     ((RepeatedPtrFieldBase *)(local_108 + 0x48),0);
  pVVar3 = protobuf::internal::RepeatedPtrFieldBase::
           Mutable<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                     (&(pVVar2->field_0)._impl_.value_.super_RepeatedPtrFieldBase,0);
  (pVVar3->field_0)._impl_.number_ = 0;
  *(byte *)&pVVar3->field_0 = *(byte *)&pVVar3->field_0 | 4;
  DescriptorPool::DescriptorPool((DescriptorPool *)local_180);
  pFVar4 = DescriptorPool::BuildFile((DescriptorPool *)local_180,(FileDescriptorProto *)local_108);
  if ((long)pFVar4->enum_type_count_ < 1) {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            (0,(long)pFVar4->enum_type_count_,"index < enum_type_count()");
  }
  else {
    failure_msg = (Nonnull<const_char_*>)0x0;
  }
  if (failure_msg == (Nonnull<const_char_*>)0x0) {
    bVar1 = EnumDescriptor::is_closed(pFVar4->enum_types_);
    local_1b8.data_._0_1_ = (internal)!bVar1;
    local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (bVar1) {
      testing::Message::Message(&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1a0,(internal *)&local_1b8,(AssertionResult *)"enum3->is_closed()","true",
                 "false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x72c,local_1a0._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if (local_1c0.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_1c0.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,local_1b0);
    }
    DescriptorPool::~DescriptorPool((DescriptorPool *)local_180);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_108);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
             ,0xae8,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0)
  ;
}

Assistant:

TEST_F(EnumDescriptorTest, IsClosed) {
  // enum_ is proto2.
  EXPECT_TRUE(enum_->is_closed());

  // Make a proto3 version of enum_.
  FileDescriptorProto foo_file3;
  foo_file_->CopyTo(&foo_file3);
  foo_file3.set_syntax("proto3");

  // Make this valid proto3 by making the first enum value be zero.
  foo_file3.mutable_enum_type(0)->mutable_value(0)->set_number(0);

  DescriptorPool pool3;
  const EnumDescriptor* enum3 = pool3.BuildFile(foo_file3)->enum_type(0);
  EXPECT_FALSE(enum3->is_closed());
}